

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

PtrTokenOrSyntax * __thiscall
slang::syntax::UdpBodySyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,UdpBodySyntax *this,size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  
  switch(this) {
  case (UdpBodySyntax *)0x0:
    pPVar1 = __return_storage_ptr__ + 2;
    break;
  case (UdpBodySyntax *)0x1:
    pPVar1 = *(PtrTokenOrSyntax **)
              &__return_storage_ptr__[5].
               super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
    break;
  case (UdpBodySyntax *)0x2:
    return (PtrTokenOrSyntax *)
           (__index_type *)
           ((long)&__return_storage_ptr__[5].
                   super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
           + 8);
  case (UdpBodySyntax *)0x3:
    pPVar1 = __return_storage_ptr__ + 7;
    break;
  case (UdpBodySyntax *)0x4:
    return (PtrTokenOrSyntax *)(__index_type *)(__return_storage_ptr__ + 10);
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return pPVar1;
}

Assistant:

PtrTokenOrSyntax UdpBodySyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &portDecls;
        case 1: return initialStmt;
        case 2: return &table;
        case 3: return &entries;
        case 4: return &endtable;
        default: return nullptr;
    }
}